

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::RootAddRef(Recycler *this,void *obj,uint *count)

{
  StackBackTraceNode *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  EntryType *pEVar7;
  StackBackTraceNode *pSVar8;
  StackBackTrace *pSVar9;
  
  BVar4 = IsValidObject(this,obj,0);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x23e,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (this->transientPinnedObject != (void *)0x0) {
    pEVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::FindOrAddEntry(&this->pinnedObjectMap,this->transientPinnedObject);
    uVar5 = (pEVar7->value).refCount;
    (pEVar7->value).refCount = uVar5 + 1;
    if (uVar5 == 0) {
      this->scanPinnedObjectMap = true;
    }
    if (this->recyclerFlagsTable->LeakStackTrace == true) {
      pSVar9 = this->transientPinnedObjectStackBackTrace;
      pSVar8 = (StackBackTraceNode *)
               NoCheckHeapAllocator::Alloc
                         ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0x10);
      pSVar1 = (pEVar7->value).stackBackTraces;
      pSVar8->stackBackTrace = pSVar9;
      pSVar8->next = pSVar1;
      (pEVar7->value).stackBackTraces = pSVar8;
    }
  }
  if (count != (uint *)0x0) {
    pEVar7 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::FindEntry(&this->pinnedObjectMap,obj);
    if (pEVar7 == (EntryType *)0x0) {
      uVar5 = 1;
    }
    else {
      uVar5 = (pEVar7->value).refCount + 1;
    }
    *count = uVar5;
  }
  this->transientPinnedObject = obj;
  if (this->recyclerFlagsTable->LeakStackTrace == true) {
    pSVar9 = StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                       ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
    this->transientPinnedObjectStackBackTrace = pSVar9;
  }
  return;
}

Assistant:

void
Recycler::RootAddRef(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject)
    {
        PinRecord& refCount = pinnedObjectMap.GetReference(transientPinnedObject);
        ++refCount;
        if (refCount == 1)
        {
            this->scanPinnedObjectMap = true;
            RECYCLER_PERF_COUNTER_INC(PinnedObject);
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount.stackBackTraces,
                transientPinnedObjectStackBackTrace);
        }
#endif
#endif
    }

    if (count != nullptr)
    {
        PinRecord* refCount = pinnedObjectMap.TryGetReference(obj);
        *count = (refCount != nullptr) ? (*refCount + 1) : 1;
    }

    transientPinnedObject = obj;

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (GetRecyclerFlagsTable().LeakStackTrace)
    {
        transientPinnedObjectStackBackTrace = StackBackTrace::Capture(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}